

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O2

time_point __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::
next_rotation_tp_(daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  time_point tp;
  time_t tVar3;
  time_point tVar4;
  duration dVar5;
  tm local_50;
  
  tp.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  now_tm(&local_50,this,tp);
  uVar1 = this->rotation_h_;
  uVar2 = this->rotation_m_;
  local_50.tm_hour = uVar1;
  local_50.tm_min = uVar2;
  local_50.tm_sec = 0;
  tVar3 = mktime((tm *)&local_50);
  dVar5.__r = tVar3 * 1000000000;
  tVar4.__d.__r = (duration)(duration)(dVar5.__r + 86400000000000);
  if (SBORROW8((long)tp.__d.__r,dVar5.__r) != (long)tp.__d.__r + tVar3 * -1000000000 < 0) {
    tVar4.__d.__r = (duration)(duration)dVar5.__r;
  }
  return (time_point)tVar4.__d.__r;
}

Assistant:

log_clock::time_point next_rotation_tp_()
    {
        auto now = log_clock::now();
        tm date = now_tm(now);
        date.tm_hour = rotation_h_;
        date.tm_min = rotation_m_;
        date.tm_sec = 0;
        auto rotation_time = log_clock::from_time_t(std::mktime(&date));
        if (rotation_time > now)
        {
            return rotation_time;
        }
        return {rotation_time + std::chrono::hours(24)};
    }